

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O0

void agentf_got_response(agentf *af,void *reply,int replylen)

{
  int local_1c;
  char *pcStack_18;
  int replylen_local;
  void *reply_local;
  agentf *af_local;
  
  af->pending = (agent_pending_query *)0x0;
  local_1c = replylen;
  pcStack_18 = (char *)reply;
  if (reply == (void *)0x0) {
    pcStack_18 = "";
    local_1c = 5;
  }
  sshfwd_write(af->c,pcStack_18,(long)local_1c);
  return;
}

Assistant:

static void agentf_got_response(agentf *af, void *reply, int replylen)
{
    af->pending = NULL;

    if (!reply) {
        /* The real agent didn't send any kind of reply at all for
         * some reason, so fake an SSH_AGENT_FAILURE. */
        reply = "\0\0\0\1\5";
        replylen = 5;
    }

    sshfwd_write(af->c, reply, replylen);
}